

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

double ov_time_total(OggVorbis_File *vf,int i)

{
  double dVar1;
  int local_2c;
  OggVorbis_File *pOStack_28;
  int i_1;
  double acc;
  int i_local;
  OggVorbis_File *vf_local;
  
  if (vf->ready_state < 2) {
    vf_local = (OggVorbis_File *)0xc060600000000000;
  }
  else if ((vf->seekable == 0) || (vf->links <= i)) {
    vf_local = (OggVorbis_File *)0xc060600000000000;
  }
  else if (i < 0) {
    pOStack_28 = (OggVorbis_File *)0x0;
    for (local_2c = 0; local_2c < vf->links; local_2c = local_2c + 1) {
      dVar1 = ov_time_total(vf,local_2c);
      pOStack_28 = (OggVorbis_File *)(dVar1 + (double)pOStack_28);
    }
    vf_local = pOStack_28;
  }
  else {
    vf_local = (OggVorbis_File *)((double)vf->pcmlengths[i * 2 + 1] / (double)vf->vi[i].rate);
  }
  return (double)vf_local;
}

Assistant:

double ov_time_total(OggVorbis_File *vf,int i){
  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable || i>=vf->links)return(OV_EINVAL);
  if(i<0){
    double acc=0;
    int i;
    for(i=0;i<vf->links;i++)
      acc+=ov_time_total(vf,i);
    return(acc);
  }else{
    return((double)(vf->pcmlengths[i*2+1])/vf->vi[i].rate);
  }
}